

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::BOITestInst<true>::Print
          (BOITestInst<true> *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",1);
  }
  DebugWriter::Print(w,L"BOIHardFailTest");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"<hardFail>: %s",L"true");
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    DebugWriter::Unindent(w);
  }
  return 1;
}

Assistant:

int BOITestInst<canHardFail>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (canHardFail)
        {
            PRINT_RE_BYTECODE_BEGIN("BOIHardFailTest");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("BOITest");
        }

        w->Print(_u("<hardFail>: %s"), canHardFail ? _u("true") : _u("false"));

        PRINT_RE_BYTECODE_MID();
        PRINT_RE_BYTECODE_END();
    }